

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O2

int secp256r1sha256_sign
              (ptls_sign_certificate_t *_self,ptls_t *tls,ptls_async_job_t **async,
              uint16_t *selected_algorithm,ptls_buffer_t *outbuf,ptls_iovec_t input,
              uint16_t *algorithms,size_t num_algorithms)

{
  uint16_t *puVar1;
  int iVar2;
  uECC_Curve curve;
  size_t sVar3;
  size_t body_size;
  undefined1 local_d2;
  undefined1 local_d1;
  uint16_t *local_d0;
  uint8_t hash [32];
  uint8_t sig [64];
  
  sVar3 = 0;
  do {
    if (num_algorithms == sVar3) {
      return 0x28;
    }
    puVar1 = algorithms + sVar3;
    sVar3 = sVar3 + 1;
  } while (*puVar1 != 0x403);
  local_d0 = selected_algorithm;
  cf_sha256_init((cf_sha256_context *)sig);
  cf_sha256_update((cf_sha256_context *)sig,input.base,input.len);
  cf_sha256_digest_final((cf_sha256_context *)sig,hash);
  (*ptls_clear_memory)((cf_sha256_context *)sig,0x70);
  curve = uECC_secp256r1();
  uECC_sign((uint8_t *)(_self + 1),hash,0x20,sig,curve);
  local_d1 = 0x30;
  iVar2 = ptls_buffer__do_pushv(outbuf,&local_d1,1);
  if (iVar2 == 0) {
    local_d2 = 0xff;
    iVar2 = ptls_buffer__do_pushv(outbuf,&local_d2,1);
    if (iVar2 == 0) {
      sVar3 = outbuf->off;
      iVar2 = ptls_buffer_push_asn1_ubigint(outbuf,sig,0x20);
      if ((iVar2 == 0) &&
         (iVar2 = ptls_buffer_push_asn1_ubigint(outbuf,sig + 0x20,0x20), iVar2 == 0)) {
        body_size = outbuf->off - sVar3;
        if (body_size < 0x80) {
          outbuf->base[sVar3 - 1] = (uint8_t)body_size;
        }
        else {
          iVar2 = ptls_buffer__adjust_asn1_blocksize(outbuf,body_size);
          if (iVar2 != 0) goto LAB_001269ea;
        }
        *local_d0 = 0x403;
        iVar2 = 0;
      }
    }
  }
LAB_001269ea:
  (*ptls_clear_memory)(hash,0x20);
  (*ptls_clear_memory)(sig,0x40);
  return iVar2;
}

Assistant:

static int secp256r1sha256_sign(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                                ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_minicrypto_secp256r1sha256_sign_certificate_t *self = (ptls_minicrypto_secp256r1sha256_sign_certificate_t *)_self;
    uint8_t hash[32], sig[64];
    size_t i;
    int ret;

    /* check algorithm */
    for (i = 0; i != num_algorithms; ++i)
        if (algorithms[i] == PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256)
            break;
    if (i == num_algorithms)
        return PTLS_ALERT_HANDSHAKE_FAILURE;

    { /* calc hash */
        cf_sha256_context ctx;
        cf_sha256_init(&ctx);
        cf_sha256_update(&ctx, input.base, input.len);
        cf_sha256_digest_final(&ctx, hash);
        ptls_clear_memory(&ctx, sizeof(ctx));
    }

    /* sign */
    uECC_sign(self->key, hash, sizeof(hash), sig, uECC_secp256r1());

    /* encode using DER */
    ptls_buffer_push_asn1_sequence(outbuf, {
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig, 32)) != 0)
            goto Exit;
        if ((ret = ptls_buffer_push_asn1_ubigint(outbuf, sig + 32, 32)) != 0)
            goto Exit;
    });

    *selected_algorithm = PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256;
    ret = 0;

Exit:
    ptls_clear_memory(hash, sizeof(hash));
    ptls_clear_memory(sig, sizeof(sig));
    return ret;
}